

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseIntOption
               (int argc,char **argv,char *pattern,optionType type,int *res)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  uint local_ac;
  int theInt;
  uint i;
  char negative [4] [6];
  char positive [4] [5];
  String local_60;
  undefined1 local_48 [8];
  String parsedValue;
  int *res_local;
  optionType type_local;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  parsedValue.field_0._16_8_ = res;
  String::String((String *)local_48);
  String::String(&local_60);
  bVar1 = parseOption(argc,argv,pattern,(String *)local_48,&local_60);
  String::~String(&local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (type == option_bool) {
      positive[0][0] = 'e';
      positive[0][1] = '\0';
      positive[0][2] = 'o';
      positive[0][3] = 'n';
      positive[0][4] = '\0';
      positive[1][0] = '\0';
      positive[1][1] = '\0';
      positive[1][2] = 'y';
      positive[1][3] = 'e';
      positive[1][4] = 's';
      positive[2][0] = '\0';
      positive[2][1] = '\0';
      _theInt = 0x6166000000000030;
      builtin_strncpy(negative[0],"lse",4);
      negative[0][4] = 'o';
      negative[0][5] = 'f';
      negative[1][0] = 'f';
      negative[1][1] = '\0';
      negative[1][2] = '\0';
      negative[1][3] = '\0';
      negative[1][4] = 'n';
      negative[1][5] = 'o';
      negative[2][0] = '\0';
      negative[2][1] = '\0';
      negative[2][2] = '\0';
      negative[2][3] = '\0';
      for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
        iVar2 = String::compare((String *)local_48,positive[(ulong)local_ac - 2] + 2,true);
        if (iVar2 == 0) {
          *(undefined4 *)parsedValue.field_0._16_8_ = 1;
          argv_local._7_1_ = true;
          goto LAB_0010ce33;
        }
        iVar2 = String::compare((String *)local_48,(char *)((long)&theInt + (ulong)local_ac * 6),
                                true);
        if (iVar2 == 0) {
          *(undefined4 *)parsedValue.field_0._16_8_ = 0;
          argv_local._7_1_ = true;
          goto LAB_0010ce33;
        }
      }
    }
    else {
      __nptr = String::c_str((String *)local_48);
      iVar2 = atoi(__nptr);
      if (iVar2 != 0) {
        *(int *)parsedValue.field_0._16_8_ = iVar2;
        argv_local._7_1_ = true;
        goto LAB_0010ce33;
      }
    }
    argv_local._7_1_ = false;
  }
  else {
    argv_local._7_1_ = false;
  }
LAB_0010ce33:
  positive[3][1] = '\x01';
  positive[3][2] = '\0';
  positive[3][3] = '\0';
  positive[3][4] = '\0';
  String::~String((String *)local_48);
  return argv_local._7_1_;
}

Assistant:

bool parseIntOption(int argc, const char* const* argv, const char* pattern, optionType type,
                        int& res) {
        String parsedValue;
        if(!parseOption(argc, argv, pattern, &parsedValue))
            return false;

        if(type == 0) {
            // boolean
            const char positive[][5] = {"1", "true", "on", "yes"};  // 5 - strlen("true") + 1
            const char negative[][6] = {"0", "false", "off", "no"}; // 6 - strlen("false") + 1

            // if the value matches any of the positive/negative possibilities
            for(unsigned i = 0; i < 4; i++) {
                if(parsedValue.compare(positive[i], true) == 0) {
                    res = 1; //!OCLINT parameter reassignment
                    return true;
                }
                if(parsedValue.compare(negative[i], true) == 0) {
                    res = 0; //!OCLINT parameter reassignment
                    return true;
                }
            }
        } else {
            // integer
            // TODO: change this to use std::stoi or something else! currently it uses undefined behavior - assumes '0' on failed parse...
            int theInt = std::atoi(parsedValue.c_str()); // NOLINT
            if(theInt != 0) {
                res = theInt; //!OCLINT parameter reassignment
                return true;
            }
        }
        return false;
    }